

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O1

float deqp::gles3::Functional::convertFloatFlushToZeroRtn
                (float value,int minExponent,int numAccurateBits)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  deUint32 u32;
  float fVar7;
  
  fVar7 = 0.0;
  if ((value != 0.0) || (NAN(value))) {
    bVar2 = 0x17 - (char)numAccurateBits;
    uVar1 = -1 << (bVar2 & 0x1f);
    if (value <= 0.0) {
      uVar4 = (uint)value & 0x7fffff;
      uVar3 = uVar4 + 0x800000;
      uVar5 = uVar3;
      if (uVar4 != 0) {
        uVar5 = uVar4;
      }
      if (((uint)value & 0x7f800000) != 0) {
        uVar5 = uVar3;
      }
      fVar7 = value;
      if ((uVar5 & ~uVar1) != 0) {
        iVar6 = ((uint)value >> 0x17 & 0xff) - 0x7f;
        if (((uint)value & 0x7f800000) == 0 && uVar4 != 0) {
          uVar3 = uVar4;
          iVar6 = -0x7e;
        }
        uVar5 = 0;
        if (((uVar3 & uVar1) != 0 || iVar6 != 0) &&
           (uVar5 = 0, iVar6 != -0x7e || 0x7fffff < (uVar3 & uVar1))) {
          uVar5 = iVar6 * 0x800000 + 0x3f800000;
        }
        if (numAccurateBits < 1) {
          fVar7 = (float)(iVar6 * 0x800000 + 0x3f800000);
        }
        else {
          fVar7 = (float)((1 << (bVar2 & 0x1f) & 0x7fffffU) + iVar6 * 0x800000 + 0x3f800000) -
                  (float)(iVar6 * 0x800000 + 0x3f800000);
        }
        return (float)(uVar1 & uVar4 | uVar5 | 0x80000000) - fVar7;
      }
    }
    else {
      uVar3 = (uint)value & 0x7fffff;
      iVar6 = -0x7e;
      if (uVar3 == 0 || 0x7fffff < (uint)value) {
        iVar6 = ((uint)value >> 0x17) - 0x7f;
      }
      if (minExponent <= iVar6) {
        uVar5 = uVar3 + 0x800000;
        if (uVar3 != 0 && 0x7fffff >= (uint)value) {
          uVar5 = uVar3;
        }
        if (value == 0.0) {
          uVar5 = uVar3;
        }
        uVar4 = 0;
        if (((uVar5 & uVar1) != 0 || iVar6 != 0) && (iVar6 != -0x7e || 0x7fffff < (uVar5 & uVar1)))
        {
          uVar4 = iVar6 * 0x800000 + 0x3f800000;
        }
        return (float)(uVar1 & uVar3 | uVar4);
      }
    }
  }
  return fVar7;
}

Assistant:

static float convertFloatFlushToZeroRtn (float value, int minExponent, int numAccurateBits)
{
	if (value == 0.0f)
	{
		return 0.0f;
	}
	else
	{
		const tcu::Float32	inputFloat			= tcu::Float32(value);
		const int			numTruncatedBits	= 23-numAccurateBits;
		const deUint32		truncMask			= (1u<<numTruncatedBits)-1u;

		if (value > 0.0f)
		{
			if (value > 0.0f && tcu::Float32(value).exponent() < minExponent)
			{
				// flush to zero if possible
				return 0.0f;
			}
			else
			{
				// just mask away non-representable bits
				return tcu::Float32::construct(+1, inputFloat.exponent(), inputFloat.mantissa() & ~truncMask).asFloat();
			}
		}
		else
		{
			if (inputFloat.mantissa() & truncMask)
			{
				// decrement one ulp if truncated bits are non-zero (i.e. if value is not representable)
				return tcu::Float32::construct(-1, inputFloat.exponent(), inputFloat.mantissa() & ~truncMask).asFloat() - getSingleULPForExponent(inputFloat.exponent(), numAccurateBits);
			}
			else
			{
				// value is representable, no need to do anything
				return value;
			}
		}
	}
}